

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O1

void __thiscall
gl3cts::TransformFeedback::CaptureVertexInterleaved::bindBuffer
          (CaptureVertexInterleaved *this,BindBufferCase bind_case)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 *puVar2;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  if (bind_case == BIND_BUFFER_OFFSET_CASE) {
    if (this->m_glBindBufferOffsetEXT != (BindBufferOffsetEXT_ProcAddress)0x0) {
      (*this->m_glBindBufferOffsetEXT)(0x8c8e,0,this->m_buffer,0);
      return;
    }
  }
  else {
    if (bind_case == BIND_BUFFER_RANGE_CASE) {
      (**(code **)(CONCAT44(extraout_var,iVar1) + 0x50))
                (0x8c8e,0,this->m_buffer,0,this->m_buffer_size);
      return;
    }
    if (bind_case == BIND_BUFFER_BASE_CASE) {
      (**(code **)(CONCAT44(extraout_var,iVar1) + 0x48))(0x8c8e,0,this->m_buffer);
      return;
    }
  }
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 0;
  __cxa_throw(puVar2,&int::typeinfo,0);
}

Assistant:

void gl3cts::TransformFeedback::CaptureVertexInterleaved::bindBuffer(BindBufferCase bind_case)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	switch (bind_case)
	{
	case BIND_BUFFER_BASE_CASE:
		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_buffer);
		break;
	case BIND_BUFFER_RANGE_CASE:
		gl.bindBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_buffer, 0, m_buffer_size);
		break;
	case BIND_BUFFER_OFFSET_CASE:
		if (DE_NULL == m_glBindBufferOffsetEXT)
		{
			throw 0;
		}
		m_glBindBufferOffsetEXT(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_buffer, 0);
		break;
	default:
		throw 0;
	}
}